

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall
duckdb_re2::RE2::DoMatch
          (RE2 *this,StringPiece *text,Anchor re_anchor,size_t *consumed,Arg **args,int n)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  StringPiece *this_00;
  long *in_RCX;
  StringPiece *in_RSI;
  RE2 *in_RDI;
  long in_R8;
  int in_R9D;
  StringPiece *s;
  int i;
  StringPiece *heapvec;
  StringPiece stkvec [17];
  StringPiece *vec;
  int nvec;
  StringPiece *in_stack_000010a0;
  Anchor in_stack_000010ac;
  size_t in_stack_000010b0;
  size_t in_stack_000010b8;
  StringPiece *in_stack_000010c0;
  RE2 *in_stack_000010c8;
  int in_stack_000010e0;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  LogMessage *in_stack_fffffffffffffc60;
  LogMessage *in_stack_fffffffffffffc70;
  StringPiece *local_350;
  StringPiece *local_328;
  int local_2f4;
  StringPiece *local_2f0;
  StringPiece local_2e8 [17];
  StringPiece SStack_1d8;
  int local_1c8;
  LogMessage local_1b8;
  int local_34;
  long local_30;
  long *local_28;
  StringPiece *local_18;
  bool local_1;
  
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  bVar2 = ok((RE2 *)0x7fe21b);
  if (bVar2) {
    iVar3 = NumberOfCapturingGroups(in_RDI);
    if (iVar3 < local_34) {
      local_1 = false;
    }
    else {
      if ((local_34 == 0) && (local_28 == (long *)0x0)) {
        local_1c8 = 0;
      }
      else {
        local_1c8 = local_34 + 1;
      }
      local_328 = local_2e8;
      do {
        StringPiece::StringPiece(local_328);
        local_328 = local_328 + 1;
      } while (local_328 != &SStack_1d8);
      local_2f0 = (StringPiece *)0x0;
      if (local_1c8 < 0x12) {
        SStack_1d8.size_ = (size_type)local_2e8;
      }
      else {
        uVar5 = (ulong)local_1c8;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar5;
        uVar6 = SUB168(auVar1 * ZEXT816(0x10),0);
        if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        local_2f0 = (StringPiece *)operator_new__(uVar6);
        SStack_1d8.size_ = (size_type)local_2f0;
        if (uVar5 != 0) {
          local_350 = local_2f0;
          do {
            StringPiece::StringPiece(local_350);
            local_350 = local_350 + 1;
          } while (local_350 != local_2f0 + uVar5);
        }
      }
      StringPiece::size(local_18);
      iVar3 = local_1c8;
      bVar2 = Match(in_stack_000010c8,in_stack_000010c0,in_stack_000010b8,in_stack_000010b0,
                    in_stack_000010ac,in_stack_000010a0,in_stack_000010e0);
      if (bVar2) {
        if (local_28 != (long *)0x0) {
          pcVar7 = EndPtr((StringPiece *)in_stack_fffffffffffffc60);
          pcVar8 = BeginPtr((StringPiece *)0x7fe52a);
          *local_28 = (long)pcVar7 - (long)pcVar8;
        }
        if ((local_34 == 0) || (local_30 == 0)) {
          if (local_2f0 != (StringPiece *)0x0) {
            operator_delete__(local_2f0);
          }
          local_1 = true;
        }
        else {
          for (local_2f4 = 0; local_2f4 < local_34; local_2f4 = local_2f4 + 1) {
            this_00 = (StringPiece *)(SStack_1d8.size_ + (long)(local_2f4 + 1) * 0x10);
            StringPiece::data(this_00);
            StringPiece::size(this_00);
            bVar2 = Arg::Parse((Arg *)in_stack_fffffffffffffc60,
                               (char *)CONCAT44(in_stack_fffffffffffffc5c,iVar3),0x7fe609);
            if (!bVar2) {
              if (local_2f0 != (StringPiece *)0x0) {
                operator_delete__(local_2f0);
              }
              return false;
            }
          }
          if (local_2f0 != (StringPiece *)0x0) {
            operator_delete__(local_2f0);
          }
          local_1 = true;
        }
      }
      else {
        if (local_2f0 != (StringPiece *)0x0) {
          operator_delete__(local_2f0);
        }
        local_1 = false;
      }
    }
  }
  else {
    bVar2 = Options::log_errors(&in_RDI->options_);
    if (bVar2) {
      LogMessage::LogMessage
                (in_stack_fffffffffffffc60,
                 (char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),0);
      poVar4 = LogMessage::stream(&local_1b8);
      poVar4 = std::operator<<(poVar4,"Invalid RE2: ");
      std::operator<<(poVar4,(string *)in_RDI->error_);
      LogMessage::~LogMessage(in_stack_fffffffffffffc70);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RE2::DoMatch(const StringPiece& text,
                  Anchor re_anchor,
                  size_t* consumed,
                  const Arg* const* args,
                  int n) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (NumberOfCapturingGroups() < n) {
    // RE has fewer capturing groups than number of Arg pointers passed in.
    return false;
  }

  // Count number of capture groups needed.
  int nvec;
  if (n == 0 && consumed == NULL)
    nvec = 0;
  else
    nvec = n+1;

  StringPiece* vec;
  StringPiece stkvec[kVecSize];
  StringPiece* heapvec = NULL;

  if (nvec <= static_cast<int>(arraysize(stkvec))) {
    vec = stkvec;
  } else {
    vec = new StringPiece[nvec];
    heapvec = vec;
  }

  if (!Match(text, 0, text.size(), re_anchor, vec, nvec)) {
    delete[] heapvec;
    return false;
  }

  if (consumed != NULL)
    *consumed = static_cast<size_t>(EndPtr(vec[0]) - BeginPtr(text));

  if (n == 0 || args == NULL) {
    // We are not interested in results
    delete[] heapvec;
    return true;
  }

  // If we got here, we must have matched the whole pattern.
  for (int i = 0; i < n; i++) {
    const StringPiece& s = vec[i+1];
    if (!args[i]->Parse(s.data(), s.size())) {
      // TODO: Should we indicate what the error was?
      delete[] heapvec;
      return false;
    }
  }

  delete[] heapvec;
  return true;
}